

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O0

RDL_cycle * RDL_cycleIteratorGetCycle(RDL_cycleIterator *it)

{
  uint uVar1;
  undefined1 uVar2;
  undefined2 uVar3;
  uchar uVar4;
  int iVar5;
  RDL_pathIterator *pRVar6;
  RDL_cycle *rdl_cycle;
  uint alloced;
  uint mapped_edge;
  uint j;
  uint edgeCount;
  RDL_cycleIterator *it_local;
  
  mapped_edge = 0;
  rdl_cycle._0_4_ = 0x40;
  if (it == (RDL_cycleIterator *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"Iterator is NULL!\n");
    it_local = (RDL_cycleIterator *)0x0;
  }
  else {
    iVar5 = RDL_cycleIteratorAtEnd(it);
    if (iVar5 == 0) {
      if (it->mode != 'b') {
        (*RDL_outputFunc)(RDL_ERROR,"Cycle conversion only works for edge defined cycles!\n");
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLhandler.c"
                      ,0x204,"RDL_cycle *RDL_cycleIteratorGetCycle(RDL_cycleIterator *)");
      }
      it_local = (RDL_cycleIterator *)malloc(0x18);
      pRVar6 = (RDL_pathIterator *)malloc(0x200);
      it_local->it1 = pRVar6;
      *(uint *)((long)&it_local->it2 + 4) = it->running_urf;
      uVar2 = *(undefined1 *)((long)&it->running_rcf + 1);
      uVar3 = *(undefined2 *)((long)&it->running_rcf + 2);
      it_local->mode = *(undefined1 *)&it->running_rcf;
      it_local->end = uVar2;
      *(undefined2 *)&it_local->field_0x12 = uVar3;
      for (alloced = 0; alloced < it->data->bccGraphs->bcc_graphs[it->bcc_index]->E;
          alloced = alloced + 1) {
        uVar4 = RDL_bitset_test(it->compressed_cycle,alloced);
        if (uVar4 != '\0') {
          if ((uint)rdl_cycle <= mapped_edge) {
            rdl_cycle._0_4_ = (uint)rdl_cycle << 1;
            pRVar6 = (RDL_pathIterator *)realloc(it_local->it1,(ulong)(uint)rdl_cycle << 3);
            it_local->it1 = pRVar6;
          }
          uVar1 = it->data->bccGraphs->edge_from_bcc_mapping[it->bcc_index][alloced];
          *(uint *)(&it_local->it1->stack + mapped_edge) = *it->data->graph->edges[uVar1];
          *(uint *)((long)&it_local->it1->stack + (ulong)mapped_edge * 8 + 4) =
               it->data->graph->edges[uVar1][1];
          mapped_edge = mapped_edge + 1;
        }
      }
      pRVar6 = (RDL_pathIterator *)realloc(it_local->it1,(ulong)mapped_edge << 3);
      it_local->it1 = pRVar6;
      *(uint *)&it_local->it2 = mapped_edge;
    }
    else {
      (*RDL_outputFunc)(RDL_ERROR,"Cannot retrieve cycle of iterator at end!\n");
      it_local = (RDL_cycleIterator *)0x0;
    }
  }
  return (RDL_cycle *)it_local;
}

Assistant:

RDL_cycle* RDL_cycleIteratorGetCycle(RDL_cycleIterator* it)
{
  unsigned edgeCount = 0, j, mapped_edge, alloced = 64;
  RDL_cycle* rdl_cycle;

  if (it == NULL) {
    RDL_outputFunc(RDL_ERROR, "Iterator is NULL!\n");
    return NULL;
  }

  if (RDL_cycleIteratorAtEnd(it)) {
    RDL_outputFunc(RDL_ERROR, "Cannot retrieve cycle of iterator at end!\n");
    return NULL;
  }

  if (it->mode != 'b') {
    RDL_outputFunc(RDL_ERROR, "Cycle conversion only works for edge defined cycles!\n");
    /* will never happen, when using the public interface! */
    assert(0);
    return NULL;
  }

  rdl_cycle = malloc(sizeof(*rdl_cycle));

  rdl_cycle->edges = malloc(alloced * sizeof(*rdl_cycle->edges));
  rdl_cycle->urf = it->running_urf;
  rdl_cycle->rcf = it->running_rcf;

  for(j=0; j < it->data->bccGraphs->bcc_graphs[it->bcc_index]->E; ++j) {
    if(RDL_bitset_test(it->compressed_cycle, j)) {
      if (edgeCount >= alloced) {
        alloced *= 2;
        rdl_cycle->edges = realloc(rdl_cycle->edges, alloced * sizeof(*rdl_cycle->edges));
      }
      mapped_edge = it->data->bccGraphs->edge_from_bcc_mapping[it->bcc_index][j];
      rdl_cycle->edges[edgeCount][0] = it->data->graph->edges[mapped_edge][0];
      rdl_cycle->edges[edgeCount][1] = it->data->graph->edges[mapped_edge][1];
      ++edgeCount;
    }
  }

  rdl_cycle->edges = realloc(rdl_cycle->edges, edgeCount * sizeof(*rdl_cycle->edges));
  rdl_cycle->weight = edgeCount;

  return rdl_cycle;
}